

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.hpp
# Opt level: O1

void __thiscall HalfMesh::Mesh::establish_connectivity(Mesh *this)

{
  pointer ppHVar1;
  HalfEdge *pHVar2;
  pointer ppEVar3;
  Edge *pEVar4;
  _Hash_node_base *p_Var5;
  long lVar6;
  ulong uVar7;
  
  for (p_Var5 = (this->face_to_one_half_edge_map)._M_h._M_before_begin._M_nxt;
      p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
    p_Var5[1]._M_nxt[4]._M_nxt = p_Var5[2]._M_nxt;
  }
  for (p_Var5 = (this->edge_to_one_half_edge_map)._M_h._M_before_begin._M_nxt;
      p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
    p_Var5[1]._M_nxt[3]._M_nxt = p_Var5[2]._M_nxt;
  }
  ppHVar1 = (this->all_half_edges).
            super__Vector_base<HalfMesh::HalfEdge_*,_std::allocator<HalfMesh::HalfEdge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar6 = (long)(this->all_half_edges).
                super__Vector_base<HalfMesh::HalfEdge_*,_std::allocator<HalfMesh::HalfEdge_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppHVar1;
  if (lVar6 != 0) {
    uVar7 = 0;
    do {
      pHVar2 = ppHVar1[uVar7];
      pHVar2->boundary_half_edge = pHVar2->opposing_half_edge == 0xffffffff;
      uVar7 = uVar7 + 1;
    } while ((uVar7 & 0xffffffff) < (ulong)(lVar6 >> 3));
  }
  ppEVar3 = (this->all_edges).
            super__Vector_base<HalfMesh::Edge_*,_std::allocator<HalfMesh::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar6 = (long)(this->all_edges).
                super__Vector_base<HalfMesh::Edge_*,_std::allocator<HalfMesh::Edge_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppEVar3;
  if (lVar6 != 0) {
    uVar7 = 0;
    do {
      pEVar4 = ppEVar3[uVar7];
      pEVar4->boundary_edge = pEVar4->one_half_edge->boundary_half_edge;
      uVar7 = uVar7 + 1;
    } while ((uVar7 & 0xffffffff) < (ulong)(lVar6 >> 3));
  }
  return;
}

Assistant:

void establish_connectivity() {
            for (auto iter = face_to_one_half_edge_map.begin(); iter != face_to_one_half_edge_map.end(); ++iter) {
                Face *face = iter->first;
                HalfEdge *halfEdge = iter->second;
                face->set_one_half_edge(halfEdge);
            }
            for (auto iter = edge_to_one_half_edge_map.begin(); iter != edge_to_one_half_edge_map.end(); ++iter) {
                Edge *edge = iter->first;
                HalfEdge *halfEdge = iter->second;
                edge->set_one_half_edge(halfEdge);
            }
            for (unsigned int i = 0; i < all_half_edges.size(); ++i) {
                HalfEdge *half_edge = all_half_edges.at(i);
                if (half_edge->get_opposing_half_edge() == std::numeric_limits<unsigned int>::max()) {
                    half_edge->set_boundary(true);
                } else {
                    half_edge->set_boundary(false);
                }
            }
            for (unsigned int i = 0; i < all_edges.size(); ++i) {
                Edge *edge = all_edges.at(i);
                HalfEdge *halfEdge = edge->get_one_half_edge();
                if (halfEdge->is_boundary()) {
                    edge->set_boundary(true);
                } else {
                    edge->set_boundary(false);
                }

            }
        }